

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.cpp
# Opt level: O1

wostream * Centaurus::operator<<(wostream *os,CharClass<char> *cc)

{
  byte bVar1;
  byte ch;
  pointer pRVar2;
  wchar_t local_3c [3];
  
  pRVar2 = (cc->m_ranges).
           super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pRVar2 != (cc->m_ranges).
                super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    local_3c[1] = 0x5b;
    std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(os,local_3c + 1,1);
    if (pRVar2 != (cc->m_ranges).
                  super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        bVar1 = pRVar2->m_end;
        ch = pRVar2->m_start;
        printc(os,ch);
        if (ch + 1 != (uint)bVar1) {
          local_3c[0] = L'-';
          std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(os,local_3c,1);
          printc(os,pRVar2->m_end + -1);
        }
        pRVar2 = pRVar2 + 1;
      } while (pRVar2 != (cc->m_ranges).
                         super__Vector_base<Centaurus::Range<char>,_std::allocator<Centaurus::Range<char>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    local_3c[2] = 0x5d;
    std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(os,local_3c + 2,1);
  }
  return os;
}

Assistant:

std::wostream& operator<<(std::wostream& os, const CharClass<TCHAR>& cc)
{
    if (cc.is_epsilon()) return os;

    auto i = cc.m_ranges.cbegin();

	os << L'[';
    for (; i != cc.m_ranges.cend();)
    {
        if (i->end() == i->start() + 1)
        {
            /*if (i->start() == wide_to_target<TCHAR>(L'"'))
                os << L"\\\"";
            else if (i->start() == wide_to_target<TCHAR>(L'\\'))
                os << L"\\\\";
            else
            {
                wchar_t ch = os.widen(i->start(), '@');
                os << (std::isprint(ch) ? ch : '@');
            }*/
			printc(os, i->start());
        }
        else
        {
			printc(os, i->start());
            os << L'-';
			printc(os, (TCHAR)(i->end() - 1));
        }
        i++;
    }
	os << L']';
    return os;
}